

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.c
# Opt level: O1

int readbtable(fitsfile *fptr,int *status)

{
  int iVar1;
  long nelem;
  long lVar2;
  long firstrow;
  long nrows;
  float elapcpu;
  int anynull;
  int hdutype;
  double elapse;
  
  iVar1 = ffmrhd(fptr,1,&hdutype,status);
  if (iVar1 == 0) {
    ffgrsz(fptr,&nrows,status);
    lVar2 = 20000;
    if (nrows < 20000) {
      lVar2 = nrows;
    }
    nrows = lVar2;
    printf("Read back BINTABLE                              ");
    marktime(status);
    firstrow = 1;
    lVar2 = 2500000;
    do {
      nelem = nrows;
      if (lVar2 <= nrows) {
        nelem = lVar2;
      }
      ffgcvj(fptr,1,firstrow,1,nelem,0,sarray,&anynull,status);
      ffgcvj(fptr,2,firstrow,1,nelem,0,sarray,&anynull,status);
      firstrow = firstrow + nelem;
      lVar2 = lVar2 - nelem;
    } while (lVar2 != 0);
    gettime(&elapse,&elapcpu,status);
    printf(" %4.1fMB/%6.3fs(%3.0f) = %5.2fMB/s\n",0x4034000000000000,elapse,
           (double)(float)(((double)elapcpu / elapse) * 100.0),(double)(float)(20.0 / elapse));
    return *status;
  }
  printerror(*status);
}

Assistant:

int readbtable( fitsfile *fptr, int *status )

    /************************************************************/
    /* read and print data values from the binary table */
    /************************************************************/
{
    int hdutype, anynull;
    long nremain, ntodo, firstrow = 1, firstelem = 1;
    long nrows;
    long lnull = 0;
    float rate, size, elapcpu, cpufrac;
    double elapse;

    /* move to the table */
    if ( fits_movrel_hdu(fptr, 1, &hdutype, status) ) 
           printerror( *status );

    /* get table row size and optimum number of rows to read per loop */
    fits_get_rowsize(fptr, &nrows, status);
    nrows = minvalue(nrows, SHTSIZE);
    
    /*  read the columns */  
    nremain = BROWS;

    printf("Read back BINTABLE                              ");
    marktime(status);

    while(nremain)
    {
      ntodo = minvalue(nrows, nremain);
      ffgcvj(fptr, 1, firstrow, firstelem, ntodo,
                     lnull, sarray, &anynull, status);
      ffgcvj(fptr, 2, firstrow, firstelem, ntodo,
                     lnull, sarray, &anynull, status);
      firstrow += ntodo; 
      nremain  -= ntodo;
    }

    gettime(&elapse, &elapcpu, status);

    cpufrac = elapcpu / elapse * 100.;
    size = BROWS * 8. / 1000000.;
    rate = size / elapse;
    printf(" %4.1fMB/%6.3fs(%3.0f) = %5.2fMB/s\n", size, elapse, cpufrac,rate);

    return( *status );
}